

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshMapper.h
# Opt level: O0

void __thiscall
anurbs::MeshMapper<3L>::MeshMapper
          (MeshMapper<3L> *this,
          Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *vertices,
          Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *faces)

{
  double dVar1;
  Index IVar2;
  CoeffReturnType CVar3;
  Matrix<double,_1,_3,_1,_1,_3> local_230;
  Matrix<double,_1,_3,_1,_1,_3> local_218;
  VectorwiseOp<Eigen::Array<double,_3,_3,_1,_3,_3>,_0> local_200;
  MaxCoeffReturnType local_1f8;
  undefined1 local_1e8 [8];
  Vector box_b;
  MinCoeffReturnType local_1c8;
  undefined1 local_1b8 [8];
  Vector box_a;
  RowXpr local_170;
  RowXpr local_140;
  RowXpr local_110;
  RowXpr local_e0;
  RowXpr local_b0;
  undefined1 local_80 [8];
  Array<double,_3,_3,_1,_3,_3> triangle;
  Index i;
  Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *faces_local;
  Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *vertices_local;
  MeshMapper<3L> *this_local;
  
  Eigen::Matrix<long,-1,3,1,-1,3>::
  Matrix<Eigen::Ref<Eigen::Matrix<long,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>>
            ((Matrix<long,_1,3,1,_1,3> *)this,faces);
  Eigen::Matrix<double,-1,3,1,-1,3>::
  Matrix<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>>
            ((Matrix<double,_1,3,1,_1,3> *)&this->m_vertices,vertices);
  IVar2 = Eigen::
          MapBase<Eigen::Ref<const_Eigen::Matrix<long,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_0>
          ::rows((MapBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                  *)faces);
  RTree<3L>::RTree(&this->m_rtree,IVar2,0x10);
  triangle.super_PlainObjectBase<Eigen::Array<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  while( true ) {
    dVar1 = triangle.super_PlainObjectBase<Eigen::Array<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8];
    IVar2 = Eigen::
            MapBase<Eigen::Ref<const_Eigen::Matrix<long,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_0>
            ::rows((MapBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                    *)faces);
    if (IVar2 <= (long)dVar1) break;
    Eigen::Array<double,_3,_3,_1,_3,_3>::Array((Array<double,_3,_3,_1,_3,_3> *)local_80);
    CVar3 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<long,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                          *)faces,(Index)triangle.
                                         super_PlainObjectBase<Eigen::Array<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data.array[8],0);
    Eigen::
    DenseBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>
    ::row(&local_b0,
          (DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
           *)vertices,CVar3);
    Eigen::DenseBase<Eigen::Array<double,_3,_3,_1,_3,_3>_>::row
              (&local_e0,(DenseBase<Eigen::Array<double,_3,_3,_1,_3,_3>_> *)local_80,0);
    Eigen::Block<Eigen::Array<double,3,3,1,3,3>,1,3,true>::operator=
              ((Block<Eigen::Array<double,3,3,1,3,3>,1,3,true> *)&local_e0,
               (DenseBase<Eigen::Block<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_1,_3,_true>_>
                *)&local_b0);
    CVar3 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<long,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                          *)faces,(Index)triangle.
                                         super_PlainObjectBase<Eigen::Array<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data.array[8],1);
    Eigen::
    DenseBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>
    ::row(&local_110,
          (DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
           *)vertices,CVar3);
    Eigen::DenseBase<Eigen::Array<double,_3,_3,_1,_3,_3>_>::row
              (&local_140,(DenseBase<Eigen::Array<double,_3,_3,_1,_3,_3>_> *)local_80,1);
    Eigen::Block<Eigen::Array<double,3,3,1,3,3>,1,3,true>::operator=
              ((Block<Eigen::Array<double,3,3,1,3,3>,1,3,true> *)&local_140,
               (DenseBase<Eigen::Block<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_1,_3,_true>_>
                *)&local_110);
    CVar3 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<long,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                          *)faces,(Index)triangle.
                                         super_PlainObjectBase<Eigen::Array<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data.array[8],2);
    Eigen::
    DenseBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>
    ::row(&local_170,
          (DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
           *)vertices,CVar3);
    Eigen::DenseBase<Eigen::Array<double,_3,_3,_1,_3,_3>_>::row
              ((RowXpr *)
               (box_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                array + 2),(DenseBase<Eigen::Array<double,_3,_3,_1,_3,_3>_> *)local_80,2);
    Eigen::Block<Eigen::Array<double,3,3,1,3,3>,1,3,true>::operator=
              ((Block<Eigen::Array<double,3,3,1,3,3>,1,3,true> *)
               (box_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                array + 2),
               (DenseBase<Eigen::Block<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_1,_3,_true>_>
                *)&local_170);
    box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
         (double)Eigen::DenseBase<Eigen::Array<double,_3,_3,_1,_3,_3>_>::colwise
                           ((DenseBase<Eigen::Array<double,_3,_3,_1,_3,_3>_> *)local_80);
    Eigen::VectorwiseOp<Eigen::Array<double,_3,_3,_1,_3,_3>,_0>::minCoeff
              (&local_1c8,
               (VectorwiseOp<Eigen::Array<double,_3,_3,_1,_3,_3>,_0> *)
               (box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,1,3,1,1,3>::
    Matrix<Eigen::PartialReduxExpr<Eigen::Array<double,3,3,1,3,3>,Eigen::internal::member_minCoeff<double>,0>>
              ((Matrix<double,1,3,1,1,3> *)local_1b8,
               (EigenBase<Eigen::PartialReduxExpr<Eigen::Array<double,_3,_3,_1,_3,_3>,_Eigen::internal::member_minCoeff<double>,_0>_>
                *)&local_1c8);
    local_200.m_matrix =
         (ExpressionTypeNested)
         Eigen::DenseBase<Eigen::Array<double,_3,_3,_1,_3,_3>_>::colwise
                   ((DenseBase<Eigen::Array<double,_3,_3,_1,_3,_3>_> *)local_80);
    Eigen::VectorwiseOp<Eigen::Array<double,_3,_3,_1,_3,_3>,_0>::maxCoeff(&local_1f8,&local_200);
    Eigen::Matrix<double,1,3,1,1,3>::
    Matrix<Eigen::PartialReduxExpr<Eigen::Array<double,3,3,1,3,3>,Eigen::internal::member_maxCoeff<double>,0>>
              ((Matrix<double,1,3,1,1,3> *)local_1e8,
               (EigenBase<Eigen::PartialReduxExpr<Eigen::Array<double,_3,_3,_1,_3,_3>,_Eigen::internal::member_maxCoeff<double>,_0>_>
                *)&local_1f8);
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
              (&local_218,(Matrix<double,_1,_3,_1,_1,_3> *)local_1b8);
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
              (&local_230,(Matrix<double,_1,_3,_1,_1,_3> *)local_1e8);
    RTree<3L>::add(&this->m_rtree,&local_218,&local_230);
    triangle.super_PlainObjectBase<Eigen::Array<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         (double)((long)triangle.super_PlainObjectBase<Eigen::Array<double,_3,_3,_1,_3,_3>_>.
                        m_storage.m_data.array[8] + 1);
  }
  RTree<3L>::finish(&this->m_rtree,true);
  return;
}

Assistant:

MeshMapper(Eigen::Ref<const Vertices>& vertices, Eigen::Ref<const Faces>& faces)
        : m_vertices(vertices)
        , m_faces(faces)
        , m_rtree(faces.rows())
    {
        for (Index i = 0; i < faces.rows(); i++) {
            Eigen::Array<double, 3, TDimension> triangle;

            triangle.row(0) = vertices.row(faces(i, 0));
            triangle.row(1) = vertices.row(faces(i, 1));
            triangle.row(2) = vertices.row(faces(i, 2));

            Vector box_a = triangle.colwise().minCoeff();
            Vector box_b = triangle.colwise().maxCoeff();

            m_rtree.add(box_a, box_b);
        }

        m_rtree.finish(true);
    }